

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_5191d8::SF_Crypt::setDecodeParms(SF_Crypt *this,QPDFObjectHandle *decode_parms)

{
  bool bVar1;
  bool local_122;
  bool local_113;
  bool local_fa;
  allocator<char> local_f9;
  string local_f8;
  byte local_d3;
  byte local_d2;
  allocator<char> local_d1;
  string local_d0;
  byte local_ab;
  byte local_aa;
  allocator<char> local_a9;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool filterable;
  QPDFObjectHandle *decode_parms_local;
  SF_Crypt *this_local;
  
  bVar1 = QPDFObjectHandle::isNull(decode_parms);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = true;
    QPDFObjectHandle::getKeys_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin2,decode_parms);
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin2);
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__begin2);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&key), bVar1) {
      local_78 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
      local_aa = 0;
      local_ab = 0;
      local_d2 = 0;
      local_d3 = 0;
      local_fa = false;
      bVar1 = std::operator==(local_78,"/Type");
      if (bVar1) {
LAB_00338e8f:
        std::allocator<char>::allocator();
        local_aa = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"/Type",&local_a9);
        local_ab = 1;
        local_fa = QPDFObjectHandle::hasKey(decode_parms,&local_a8);
        local_122 = true;
        if (local_fa) {
          std::allocator<char>::allocator();
          local_d2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,"/CryptFilterDecodeParms",&local_d1);
          local_d3 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
          local_122 = QPDFObjectHandle::isDictionaryOfType(decode_parms,&local_d0,&local_f8);
        }
        local_113 = local_122;
      }
      else {
        bVar1 = std::operator==(local_78,"/Name");
        local_113 = false;
        if (bVar1) goto LAB_00338e8f;
      }
      if (local_fa != false) {
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
      }
      if ((local_d3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_d0);
      }
      if ((local_d2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_d1);
      }
      if ((local_ab & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a8);
      }
      if ((local_aa & 1) != 0) {
        std::allocator<char>::~allocator(&local_a9);
      }
      if (local_113 == false) {
        this_local._7_1_ = false;
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__begin2);
  }
  return this_local._7_1_;
}

Assistant:

bool
        setDecodeParms(QPDFObjectHandle decode_parms) override
        {
            if (decode_parms.isNull()) {
                return true;
            }
            bool filterable = true;
            for (auto const& key: decode_parms.getKeys()) {
                if (((key == "/Type") || (key == "/Name")) &&
                    ((!decode_parms.hasKey("/Type")) ||
                     decode_parms.isDictionaryOfType("/CryptFilterDecodeParms"))) {
                    // we handle this in decryptStream
                } else {
                    filterable = false;
                }
            }
            return filterable;
        }